

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

string * __thiscall
fasttext::Args::lossToString_abi_cxx11_(string *__return_storage_ptr__,Args *this,loss_name ln)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(ln) {
  case hs:
    __s = "hs";
    __a = &local_9;
    break;
  case ns:
    __s = "ns";
    __a = &local_a;
    break;
  case softmax:
    __s = "softmax";
    __a = &local_b;
    break;
  case ova:
    __s = "one-vs-all";
    __a = &local_c;
    break;
  default:
    __s = "Unknown loss!";
    __a = &local_d;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string Args::lossToString(loss_name ln) const {
  switch (ln) {
    case loss_name::hs:
      return "hs";
    case loss_name::ns:
      return "ns";
    case loss_name::softmax:
      return "softmax";
    case loss_name::ova:
      return "one-vs-all";
  }
  return "Unknown loss!"; // should never happen
}